

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferPoolTest.cpp
# Opt level: O2

void __thiscall BufferPool_SmallBuffers_Test::TestBody(BufferPool_SmallBuffers_Test *this)

{
  BufferPool *this_00;
  FreeNode *node;
  FreeNode *pFVar1;
  FreeNode *pFVar2;
  size_t i;
  long lVar3;
  FreeNode *node_2;
  FreeNode *node_1;
  long lVar4;
  bool bVar5;
  BufferPool local_118 [4];
  BufferPool local_58;
  
  memt::BufferPool::BufferPool(local_118,1);
  memt::BufferPool::BufferPool(local_118 + 1,2);
  memt::BufferPool::BufferPool(local_118 + 2,3);
  memt::BufferPool::BufferPool(local_118 + 3,4);
  memt::BufferPool::BufferPool(&local_58,5);
  for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
    this_00 = local_118 + lVar3;
    pFVar1 = (FreeNode *)memt::BufferPool::alloc(this_00);
    pFVar1->next = local_118[lVar3]._free;
    local_118[lVar3]._free = pFVar1;
    pFVar1 = (FreeNode *)memt::BufferPool::alloc(this_00);
    pFVar2 = (FreeNode *)memt::BufferPool::alloc(this_00);
    memt::BufferPool::alloc(this_00);
    pFVar2->next = local_118[lVar3]._free;
    local_118[lVar3]._free = pFVar2;
    lVar4 = 10000;
    while (bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
      memt::BufferPool::alloc(this_00);
    }
    pFVar1->next = local_118[lVar3]._free;
    local_118[lVar3]._free = pFVar1;
  }
  lVar3 = 0xd0;
  do {
    memt::MemoryBlocks::~MemoryBlocks((MemoryBlocks *)((long)&local_118[0]._bufferSize + lVar3));
    lVar3 = lVar3 + -0x30;
  } while (lVar3 != -0x20);
  return;
}

Assistant:

TEST(BufferPool, SmallBuffers) {
  memt::BufferPool pools[] = {1, 2, 3, 4, 5};
  for (size_t i = 0; i < sizeof(pools) / sizeof(memt::BufferPool); ++i) {
    memt::BufferPool& pool = pools[i];
    void* a = pool.alloc();
    pool.free(a);
    void* b = pool.alloc();
    void* c = pool.alloc();
    pool.alloc();
    pool.free(c);
    for (size_t i = 0; i < 10000; ++i)
      pool.alloc();
    pool.free(b);
  }
}